

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_disk_posix.c
# Opt level: O0

wchar_t setup_current_filesystem(archive_read_disk *a)

{
  tree *t_00;
  wchar_t wVar1;
  int __fildes;
  char *__file;
  uint *puVar2;
  archive *in_RDI;
  wchar_t fd;
  wchar_t xr;
  wchar_t vr;
  wchar_t r;
  statvfs svfs;
  statfs sfs;
  tree *t;
  char *in_stack_fffffffffffffec8;
  tree *in_stack_fffffffffffffed0;
  wchar_t fd_00;
  tree *in_stack_fffffffffffffed8;
  tree *t_01;
  wchar_t local_10c;
  int local_108;
  int local_104;
  statvfs local_100;
  long local_90;
  size_t local_50;
  
  t_00 = (tree *)in_RDI[1].vtable;
  local_10c = L'\0';
  wVar1 = tree_current_is_symblic_link_target(in_stack_fffffffffffffed0);
  fd_00 = (wchar_t)((ulong)in_stack_fffffffffffffed0 >> 0x20);
  if (wVar1 == L'\0') {
    wVar1 = tree_current_dir_fd(t_00);
    local_108 = fstatvfs(wVar1,&local_100);
    wVar1 = tree_current_dir_fd(t_00);
    local_104 = fstatfs(wVar1,(statfs *)&local_90);
    if (local_104 == 0) {
      t_01 = t_00;
      tree_current_dir_fd(t_00);
      local_10c = get_xfer_size(t_01,fd_00,in_stack_fffffffffffffec8);
    }
  }
  else {
    wVar1 = tree_current_dir_fd(t_00);
    __file = tree_current_access_path(t_00);
    __fildes = openat(wVar1,__file,0x80000);
    __archive_ensure_cloexec_flag(0);
    if (__fildes < 0) {
      puVar2 = (uint *)__errno_location();
      archive_set_error(in_RDI,(int)(ulong)*puVar2,"openat failed");
      return L'\xffffffe7';
    }
    local_108 = fstatvfs(__fildes,&local_100);
    local_104 = fstatfs(__fildes,(statfs *)&local_90);
    if (local_104 == 0) {
      local_10c = get_xfer_size(in_stack_fffffffffffffed8,fd_00,in_stack_fffffffffffffec8);
    }
    close(__fildes);
  }
  if (((local_104 == -1) || (local_10c == L'\xffffffff')) || (local_108 == -1)) {
    t_00->current_filesystem->synthetic = -1;
    t_00->current_filesystem->remote = -1;
    puVar2 = (uint *)__errno_location();
    archive_set_error(in_RDI,(int)(ulong)*puVar2,"statfs failed");
    return L'\xffffffe7';
  }
  if (local_10c == L'\x01') {
    t_00->current_filesystem->xfer_align = local_100.f_frsize;
    t_00->current_filesystem->max_xfer_size = -1;
    t_00->current_filesystem->min_xfer_size = local_100.f_bsize;
    t_00->current_filesystem->incr_xfer_size = local_100.f_bsize;
  }
  if (local_90 == 0x1373) {
LAB_00128595:
    t_00->current_filesystem->remote = 0;
    t_00->current_filesystem->synthetic = 1;
  }
  else {
    if (((local_90 != 0x517b) && (local_90 != 0x564c)) && (local_90 != 0x6969)) {
      if ((local_90 == 0x9fa0) || (local_90 == 0x9fa2)) goto LAB_00128595;
      if (((local_90 != 0x5346414f) && (local_90 != 0x73757245)) && (local_90 != 0xff534d42)) {
        t_00->current_filesystem->remote = 0;
        t_00->current_filesystem->synthetic = 0;
        goto LAB_001285ef;
      }
    }
    t_00->current_filesystem->remote = 1;
    t_00->current_filesystem->synthetic = 0;
  }
LAB_001285ef:
  if ((local_100.f_flag & 0x400) == 0) {
    t_00->current_filesystem->noatime = 0;
  }
  else {
    t_00->current_filesystem->noatime = 1;
  }
  t_00->current_filesystem->name_max = local_50;
  return L'\0';
}

Assistant:

static int
setup_current_filesystem(struct archive_read_disk *a)
{
	struct tree *t = a->tree;
	struct statfs sfs;
	struct statvfs svfs;
	int r, vr = 0, xr = 0;

	if (tree_current_is_symblic_link_target(t)) {
#if defined(HAVE_OPENAT)
		/*
		 * Get file system statistics on any directory
		 * where current is.
		 */
		int fd = openat(tree_current_dir_fd(t),
		    tree_current_access_path(t), O_RDONLY | O_CLOEXEC);
		__archive_ensure_cloexec_flag(fd);
		if (fd < 0) {
			archive_set_error(&a->archive, errno,
			    "openat failed");
			return (ARCHIVE_FAILED);
		}
		vr = fstatvfs(fd, &svfs);/* for f_flag, mount flags */
		r = fstatfs(fd, &sfs);
		if (r == 0)
			xr = get_xfer_size(t, fd, NULL);
		close(fd);
#else
		if (tree_enter_working_dir(t) != 0) {
			archive_set_error(&a->archive, errno, "fchdir failed");
			return (ARCHIVE_FAILED);
		}
		vr = statvfs(tree_current_access_path(t), &svfs);
		r = statfs(tree_current_access_path(t), &sfs);
		if (r == 0)
			xr = get_xfer_size(t, -1, tree_current_access_path(t));
#endif
	} else {
#ifdef HAVE_FSTATFS
		vr = fstatvfs(tree_current_dir_fd(t), &svfs);
		r = fstatfs(tree_current_dir_fd(t), &sfs);
		if (r == 0)
			xr = get_xfer_size(t, tree_current_dir_fd(t), NULL);
#else
		if (tree_enter_working_dir(t) != 0) {
			archive_set_error(&a->archive, errno, "fchdir failed");
			return (ARCHIVE_FAILED);
		}
		vr = statvfs(".", &svfs);
		r = statfs(".", &sfs);
		if (r == 0)
			xr = get_xfer_size(t, -1, ".");
#endif
	}
	if (r == -1 || xr == -1 || vr == -1) {
		t->current_filesystem->synthetic = -1;
		t->current_filesystem->remote = -1;
		archive_set_error(&a->archive, errno, "statfs failed");
		return (ARCHIVE_FAILED);
	} else if (xr == 1) {
		/* pathconf(_PC_REX_*) operations are not supported. */
		t->current_filesystem->xfer_align = svfs.f_frsize;
		t->current_filesystem->max_xfer_size = -1;
		t->current_filesystem->min_xfer_size = svfs.f_bsize;
		t->current_filesystem->incr_xfer_size = svfs.f_bsize;
	}
	switch (sfs.f_type) {
	case AFS_SUPER_MAGIC:
	case CIFS_SUPER_MAGIC:
	case CODA_SUPER_MAGIC:
	case NCP_SUPER_MAGIC:/* NetWare */
	case NFS_SUPER_MAGIC:
	case SMB_SUPER_MAGIC:
		t->current_filesystem->remote = 1;
		t->current_filesystem->synthetic = 0;
		break;
	case DEVFS_SUPER_MAGIC:
	case PROC_SUPER_MAGIC:
	case USBDEVICE_SUPER_MAGIC:
		t->current_filesystem->remote = 0;
		t->current_filesystem->synthetic = 1;
		break;
	default:
		t->current_filesystem->remote = 0;
		t->current_filesystem->synthetic = 0;
		break;
	}

#if defined(ST_NOATIME)
	if (svfs.f_flag & ST_NOATIME)
		t->current_filesystem->noatime = 1;
	else
#endif
		t->current_filesystem->noatime = 0;

#if defined(HAVE_READDIR_R)
	/* Set maximum filename length. */
	t->current_filesystem->name_max = sfs.f_namelen;
#endif
	return (ARCHIVE_OK);
}